

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

bool pbrt::RemapPixelCoords(Point2i *pp,Point2i resolution,WrapMode2D wrapMode)

{
  WrapMode WVar1;
  array<pbrt::WrapMode,_2> aVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  array<pbrt::WrapMode,_2> local_10;
  
  local_10 = wrapMode.wrap.values;
  aVar2.values = local_10.values;
  uVar7 = resolution.super_Tuple2<pbrt::Point2,_int>.x;
  uVar8 = resolution.super_Tuple2<pbrt::Point2,_int>.y;
  if (wrapMode.wrap.values[0] != OctahedralSphere) {
    lVar9 = 0;
    bVar3 = false;
    do {
      bVar10 = lVar9 != 0;
      uVar6 = uVar8;
      if (!bVar10) {
        uVar6 = uVar7;
      }
      iVar4 = (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[bVar10];
      if (iVar4 < 0 || (int)uVar6 <= iVar4) {
        WVar1 = local_10.values[lVar9];
        if (WVar1 == Repeat) {
          uVar6 = uVar8;
          if (lVar9 == 0) {
            uVar6 = uVar7;
          }
          iVar5 = (iVar4 % (int)uVar6 >> 0x1f & uVar6) + iVar4 % (int)uVar6;
        }
        else {
          if (WVar1 != Clamp) {
            if (WVar1 == Black) {
              return bVar3;
            }
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
                     ,0x8d,"Unhandled WrapMode mode");
          }
          uVar6 = uVar8;
          if (lVar9 == 0) {
            uVar6 = uVar7;
          }
          iVar5 = uVar6 - 1;
          if (iVar4 < (int)(uVar6 - 1)) {
            iVar5 = iVar4;
          }
          if (iVar4 < 0) {
            iVar5 = 0;
          }
        }
        (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[bVar10] = iVar5;
      }
      lVar9 = lVar9 + 1;
      bVar3 = lVar9 != 1;
    } while (lVar9 == 1);
    return bVar3;
  }
  local_10.values[1] = wrapMode.wrap.values[1];
  if (local_10.values[1] != OctahedralSphere) {
    local_10.values = aVar2.values;
    LogFatal<char_const(&)[47]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
               ,100,"Check failed: %s",
               (char (*) [47])"wrapMode.wrap[1] == WrapMode::OctahedralSphere");
  }
  uVar6 = (pp->super_Tuple2<pbrt::Point2,_int>).x;
  if ((int)uVar6 < 0) {
    iVar4 = -uVar6;
LAB_002570cc:
    (pp->super_Tuple2<pbrt::Point2,_int>).x = iVar4;
    (pp->super_Tuple2<pbrt::Point2,_int>).y = ~(pp->super_Tuple2<pbrt::Point2,_int>).y + uVar8;
  }
  else if ((int)uVar7 <= (int)uVar6) {
    iVar4 = ~uVar6 + uVar7 * 2;
    goto LAB_002570cc;
  }
  uVar6 = (pp->super_Tuple2<pbrt::Point2,_int>).y;
  if ((int)uVar6 < 0) {
    (pp->super_Tuple2<pbrt::Point2,_int>).x = ~(pp->super_Tuple2<pbrt::Point2,_int>).x + uVar7;
    iVar4 = -uVar6;
  }
  else {
    if ((int)uVar6 < (int)uVar8) goto LAB_00257102;
    (pp->super_Tuple2<pbrt::Point2,_int>).x = ~(pp->super_Tuple2<pbrt::Point2,_int>).x + uVar7;
    iVar4 = ~uVar6 + uVar8 * 2;
  }
  (pp->super_Tuple2<pbrt::Point2,_int>).y = iVar4;
LAB_00257102:
  if (uVar7 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).x = 0;
  }
  if (uVar8 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).y = 0;
  }
  return true;
}

Assistant:

PBRT_CPU_GPU inline bool RemapPixelCoords(Point2i *pp, Point2i resolution,
                                          WrapMode2D wrapMode) {
    Point2i &p = *pp;

    if (wrapMode.wrap[0] == WrapMode::OctahedralSphere) {
        CHECK(wrapMode.wrap[1] == WrapMode::OctahedralSphere);
        if (p[0] < 0) {
            p[0] = -p[0];                     // mirror across u = 0
            p[1] = resolution[1] - 1 - p[1];  // mirror across v = 0.5
        } else if (p[0] >= resolution[0]) {
            p[0] = 2 * resolution[0] - 1 - p[0];  // mirror across u = 1
            p[1] = resolution[1] - 1 - p[1];      // mirror across v = 0.5
        }

        if (p[1] < 0) {
            p[0] = resolution[0] - 1 - p[0];  // mirror across u = 0.5
            p[1] = -p[1];                     // mirror across v = 0;
        } else if (p[1] >= resolution[1]) {
            p[0] = resolution[0] - 1 - p[0];      // mirror across u = 0.5
            p[1] = 2 * resolution[1] - 1 - p[1];  // mirror across v = 1
        }

        // Bleh: things don't go as expected for 1x1 images.
        if (resolution[0] == 1)
            p[0] = 0;
        if (resolution[1] == 1)
            p[1] = 0;

        return true;
    }

    for (int c = 0; c < 2; ++c) {
        if (p[c] >= 0 && p[c] < resolution[c])
            // in bounds
            continue;

        switch (wrapMode.wrap[c]) {
        case WrapMode::Repeat:
            p[c] = Mod(p[c], resolution[c]);
            break;
        case WrapMode::Clamp:
            p[c] = Clamp(p[c], 0, resolution[c] - 1);
            break;
        case WrapMode::Black:
            return false;
        default:
            LOG_FATAL("Unhandled WrapMode mode");
        }
    }
    return true;
}